

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O2

string * __thiscall
helics::Federate::localNameGenerator_abi_cxx11_
          (string *__return_storage_ptr__,Federate *this,string_view addition)

{
  string *localName;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20._M_str = addition._M_str;
  local_20._M_len = addition._M_len;
  if (local_20._M_len == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,&this->mName);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,this->nameSegmentSeparator);
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)__return_storage_ptr__,&local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Federate::localNameGenerator(std::string_view addition) const
{
    if (!addition.empty()) {
        std::string localName = getName();
        localName.push_back(nameSegmentSeparator);
        localName.append(addition);
        return localName;
    }
    return std::string{};
}